

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void mg_template(mg_connection *conn,char *s,mg_expansion *expansions)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  int iVar7;
  mg_expansion *pmVar8;
  char *__s;
  int iVar9;
  long lVar11;
  connection *conn_1;
  int iVar10;
  
  if (*s != '\0') {
    bVar2 = false;
    iVar5 = 0;
    lVar11 = 0;
    do {
      iVar10 = (int)lVar11;
      iVar9 = iVar5;
      if (bVar2) {
LAB_00106320:
        bVar2 = true;
        iVar5 = iVar9;
        if (*(short *)(s + lVar11) == 0x7d7d) {
          __s = expansions->keyword;
          bVar2 = false;
          if (__s != (char *)0x0) {
            iVar7 = (iVar10 - iVar9) + -2;
            pmVar8 = expansions + 1;
            do {
              sVar6 = strlen(__s);
              if ((iVar7 == (int)sVar6) &&
                 (iVar4 = bcmp(__s,s + (long)iVar9 + 2,(long)iVar7), iVar4 == 0)) {
                (*pmVar8[-1].handler)(conn);
                iVar5 = iVar10 + 2;
                break;
              }
              __s = pmVar8->keyword;
              pmVar8 = pmVar8 + 1;
            } while (__s != (char *)0x0);
            bVar2 = false;
          }
        }
      }
      else {
        bVar2 = false;
        if (*(short *)(s + lVar11) == 0x7b7b) {
          iVar9 = iVar10;
          if (iVar5 < lVar11) {
            terminate_headers(conn);
            write_chunk((connection *)&conn[-1].callback_param,s + iVar5,iVar10 - iVar5);
          }
          goto LAB_00106320;
        }
      }
      lVar1 = lVar11 + 1;
      lVar3 = lVar11 + 1;
      lVar11 = lVar1;
    } while (s[lVar3] != '\0');
    iVar10 = (int)lVar1;
    iVar9 = iVar10 - iVar5;
    if (iVar9 != 0 && iVar5 <= iVar10) {
      terminate_headers(conn);
      write_chunk((connection *)&conn[-1].callback_param,s + iVar5,iVar9);
      return;
    }
  }
  return;
}

Assistant:

void mg_template(struct mg_connection *conn, const char *s,
                 struct mg_expansion *expansions) {
  int i, j, pos = 0, inside_marker = 0;

  for (i = 0; s[i] != '\0'; i++) {
    if (inside_marker == 0 && !memcmp(&s[i], "{{", 2)) {
      if (i > pos) {
        mg_send_data(conn, &s[pos], i - pos);
      }
      pos = i;
      inside_marker = 1;
    }
    if (inside_marker == 1 && !memcmp(&s[i], "}}", 2)) {
      for (j = 0; expansions[j].keyword != NULL; j++) {
        const char *kw = expansions[j].keyword;
        if ((int) strlen(kw) == i - (pos + 2) &&
            memcmp(kw, &s[pos + 2], i - (pos + 2)) == 0) {
          expansions[j].handler(conn);
          pos = i + 2;
          break;
        }
      }
      inside_marker = 0;
    }
  }
  if (i > pos) {
    mg_send_data(conn, &s[pos], i - pos);
  }
}